

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::RegisterTests
          (ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest> *this)

{
  pointer psVar1;
  pointer pIVar2;
  ParamNameGeneratorFunc *pPVar3;
  char *pcVar4;
  _Alloc_hider name;
  char cVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  pointer __lhs;
  undefined4 extraout_var;
  long *plVar10;
  uchar *obj_bytes;
  ostream *poVar11;
  size_type sVar12;
  char *pcVar13;
  undefined4 extraout_var_01;
  TestFactoryBase *factory;
  undefined4 extraout_var_02;
  bool bVar14;
  size_type index;
  ulong uVar15;
  pointer psVar16;
  bool bVar17;
  size_t local_320;
  string param_name;
  ParamGenerator<(anonymous_namespace)::KnownAEAD> generator;
  string test_name;
  string test_suite_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  char *local_248 [4];
  string local_228;
  CodeLocation local_208;
  CodeLocation local_1e0;
  undefined1 local_1b8 [32];
  char local_198 [8];
  _func_EVP_AEAD_ptr *p_Stack_190;
  char *local_188;
  undefined8 uStack_180;
  size_t local_178;
  long *plVar9;
  undefined4 extraout_var_00;
  
  test_suite_name._M_dataplus._M_p = (pointer)&test_suite_name.field_2;
  test_suite_name._M_string_length = 0;
  bVar14 = false;
  test_suite_name.field_2._M_local_buf[0] = '\0';
  test_name._M_dataplus._M_p = (pointer)&test_name.field_2;
  test_name._M_string_length = 0;
  test_name.field_2._M_local_buf[0] = '\0';
  psVar1 = (this->tests_).
           super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar16 = (this->tests_).
                 super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar16 != psVar1; psVar16 = psVar16 + 1
      ) {
    __lhs = (this->instantiations_).
            super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::InstantiationInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
    pIVar2 = (this->instantiations_).
             super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::InstantiationInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      if (__lhs == pIVar2) break;
      (*__lhs->generator)(&generator);
      pPVar3 = __lhs->name_func;
      pcVar4 = __lhs->file;
      iVar8 = __lhs->line;
      if ((__lhs->name)._M_string_length == 0) {
        test_suite_name._M_string_length = 0;
        *test_suite_name._M_dataplus._M_p = '\0';
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b8,&__lhs->name,"/");
        std::__cxx11::string::operator=((string *)&test_suite_name,(string *)local_1b8);
        std::__cxx11::string::~string((string *)local_1b8);
      }
      std::__cxx11::string::append((string *)&test_suite_name);
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &test_param_names._M_t._M_impl.super__Rb_tree_header._M_header;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar7 = (*(generator.impl_.
                 super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::KnownAEAD>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
      plVar9 = (long *)CONCAT44(extraout_var,iVar7);
      iVar7 = (*(generator.impl_.
                 super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::KnownAEAD>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
      plVar10 = (long *)CONCAT44(extraout_var_00,iVar7);
      local_320 = 0;
      bVar17 = bVar14;
      while ((bVar6 = bVar14, plVar9 != plVar10 &&
             (cVar5 = (**(code **)(*plVar9 + 0x30))(), bVar6 = bVar17, cVar5 == '\0'))) {
        obj_bytes = (uchar *)(**(code **)(*plVar9 + 0x28))();
        test_name._M_string_length = 0;
        *test_name._M_dataplus._M_p = '\0';
        local_1b8._0_8_ = *(undefined8 *)obj_bytes;
        local_1b8._8_8_ = *(undefined8 *)(obj_bytes + 8);
        local_1b8._16_8_ = *(undefined8 *)(obj_bytes + 0x10);
        local_1b8._24_8_ = *(undefined8 *)(obj_bytes + 0x18);
        local_198 = *(char (*) [8])(obj_bytes + 0x20);
        p_Stack_190 = *(_func_EVP_AEAD_ptr **)(obj_bytes + 0x28);
        local_188 = *(char **)(obj_bytes + 0x30);
        uStack_180 = *(undefined8 *)(obj_bytes + 0x38);
        local_178 = local_320;
        (*pPVar3)(&param_name,(TestParamInfo<(anonymous_namespace)::KnownAEAD> *)local_1b8);
        if (param_name._M_string_length == 0) {
          bVar17 = false;
        }
        else {
          for (uVar15 = 0;
              (bVar17 = param_name._M_string_length <= uVar15, !bVar17 &&
              ((bVar6 = IsAlNum(param_name._M_dataplus._M_p[uVar15]), bVar6 ||
               (param_name._M_dataplus._M_p[uVar15] == '_')))); uVar15 = uVar15 + 1) {
          }
        }
        bVar17 = IsTrue(bVar17);
        if (!bVar17) {
          GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x247);
          poVar11 = std::operator<<((ostream *)&std::cerr,
                                    "Condition IsValidParamName(param_name) failed. ");
          poVar11 = std::operator<<(poVar11,"Parameterized test name \'");
          poVar11 = std::operator<<(poVar11,(string *)&param_name);
          poVar11 = std::operator<<(poVar11,
                                    "\' is invalid (contains spaces, dashes, or any non-alphanumeric characters other than underscores), in "
                                   );
          poVar11 = std::operator<<(poVar11,pcVar4);
          poVar11 = std::operator<<(poVar11," line ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar8);
          poVar11 = std::operator<<(poVar11,"");
          std::endl<char,std::char_traits<char>>(poVar11);
          GTestLog::~GTestLog((GTestLog *)local_1b8);
        }
        sVar12 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::count(&test_param_names,&param_name);
        bVar17 = IsTrue(sVar12 == 0);
        if (!bVar17) {
          GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x24d);
          poVar11 = std::operator<<((ostream *)&std::cerr,
                                    "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar11 = std::operator<<(poVar11,"Duplicate parameterized test name \'");
          poVar11 = std::operator<<(poVar11,(string *)&param_name);
          poVar11 = std::operator<<(poVar11,"\', in ");
          poVar11 = std::operator<<(poVar11,pcVar4);
          poVar11 = std::operator<<(poVar11," line ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar8);
          std::endl<char,std::char_traits<char>>(poVar11);
          GTestLog::~GTestLog((GTestLog *)local_1b8);
        }
        if ((((psVar16->
              super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->test_base_name)._M_string_length != 0) {
          pcVar13 = (char *)std::__cxx11::string::append((string *)&test_name);
          std::__cxx11::string::append(pcVar13);
        }
        std::__cxx11::string::append((string *)&test_name);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&test_param_names,&param_name);
        std::__cxx11::string::string((string *)&local_228,(string *)&test_suite_name);
        name = test_name._M_dataplus;
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        PrintBytesInObjectTo(obj_bytes,0x40,(ostream *)(local_1b8 + 0x10));
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        pcVar13 = local_248[0];
        CodeLocation::CodeLocation
                  (&local_1e0,
                   &((psVar16->
                     super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->code_location);
        iVar7 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
                  [3])(this);
        bVar17 = IsTrue(true);
        if (!bVar17) {
          GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x201);
          poVar11 = std::operator<<((ostream *)&std::cerr,
                                    "Condition !test_case_fp || !test_suite_fp failed. ");
          poVar11 = std::operator<<(poVar11,
                                    "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                                   );
          poVar11 = std::operator<<(poVar11,pcVar4);
          poVar11 = std::operator<<(poVar11,":");
          std::ostream::operator<<(poVar11,iVar8);
          GTestLog::~GTestLog((GTestLog *)local_1b8);
        }
        bVar17 = IsTrue(true);
        if (!bVar17) {
          GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x216);
          poVar11 = std::operator<<((ostream *)&std::cerr,
                                    "Condition !test_case_fp || !test_suite_fp failed. ");
          poVar11 = std::operator<<(poVar11,
                                    "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                                   );
          poVar11 = std::operator<<(poVar11,pcVar4);
          poVar11 = std::operator<<(poVar11,":");
          std::ostream::operator<<(poVar11,iVar8);
          GTestLog::~GTestLog((GTestLog *)local_1b8);
        }
        factory = (TestFactoryBase *)
                  (**(code **)(*(long *)(((psVar16->
                                          super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr)->test_meta_factory)._M_t.
                                        super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<(anonymous_namespace)::KnownAEAD>,_std::default_delete<testing::internal::TestMetaFactoryBase<(anonymous_namespace)::KnownAEAD>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<(anonymous_namespace)::KnownAEAD>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<(anonymous_namespace)::KnownAEAD>_>_>
                                        .
                                        super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<(anonymous_namespace)::KnownAEAD>_*,_false>
                              + 0x10))();
        MakeAndRegisterTestInfo
                  (&local_228,name._M_p,(char *)0x0,pcVar13,&local_1e0,
                   (TypeId)CONCAT44(extraout_var_01,iVar7),(SetUpTestSuiteFunc)0x0,
                   (TearDownTestSuiteFunc)0x0,factory);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__cxx11::string::~string((string *)local_248);
        std::__cxx11::string::~string((string *)&local_228);
        local_320 = local_320 + 1;
        std::__cxx11::string::~string((string *)&param_name);
        bVar17 = true;
        (**(code **)(*plVar9 + 0x18))(plVar9);
      }
      bVar14 = bVar6;
      if (plVar10 != (long *)0x0) {
        (**(code **)(*plVar10 + 8))(plVar10);
      }
      if (plVar9 != (long *)0x0) {
        (**(code **)(*plVar9 + 8))();
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&test_param_names._M_t);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&generator.impl_.
                  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::KnownAEAD>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      __lhs = __lhs + 1;
    }
  }
  if (!bVar14) {
    iVar8 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase[2])
                      (this);
    CodeLocation::CodeLocation(&local_208,&this->code_location_);
    InsertSyntheticTestCase
              ((string *)CONCAT44(extraout_var_02,iVar8),&local_208,
               (this->tests_).
               super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               (this->tests_).
               super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::__cxx11::string::~string((string *)&local_208);
  }
  std::__cxx11::string::~string((string *)&test_name);
  std::__cxx11::string::~string((string *)&test_suite_name);
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    std::string test_suite_name;
    std::string test_name;
    for (const std::shared_ptr<TestInfo>& test_info : tests_) {
      for (const InstantiationInfo& instantiation : instantiations_) {
        const std::string& instantiation_name = instantiation.name;
        ParamGenerator<ParamType> generator((*instantiation.generator)());
        ParamNameGeneratorFunc* name_func = instantiation.name_func;
        const char* file = instantiation.file;
        int line = instantiation.line;

        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        else
          test_suite_name.clear();
        test_suite_name += test_suite_name_;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (const auto& param : generator) {
          generated_instantiations = true;

          test_name.clear();

          std::string param_name =
              name_func(TestParamInfo<ParamType>(param, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid (contains spaces, dashes, or any "
                 "non-alphanumeric characters other than underscores), in "
              << file << " line " << line << "" << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          if (!test_info->test_base_name.empty()) {
            test_name.append(test_info->test_base_name).append("/");
          }
          test_name += param_name;

          test_param_names.insert(std::move(param_name));

          MakeAndRegisterTestInfo(
              test_suite_name, test_name.c_str(),
              nullptr,  // No type parameter.
              PrintToString(param).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(param));
          ++i;
        }  // for param
      }  // for instantiation
    }  // for test_info

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }